

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateExtraDefaultFields
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  CppType CVar1;
  CType CVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  int j;
  long lVar5;
  long lVar6;
  string local_50;
  
  if ((0 < *(int *)(this->descriptor_ + 0x38)) || (0 < this->num_weak_fields_)) {
    io::Printer::Print(printer,"public:\n");
    pDVar4 = this->descriptor_;
    for (field = (FieldDescriptor *)0x0; (long)field < (long)*(int *)(pDVar4 + 0x38);
        field = field + 1) {
      for (lVar5 = 0; lVar5 < *(int *)(*(long *)(pDVar4 + 0x40) + 0x1c + (long)field * 0x30);
          lVar5 = lVar5 + 1) {
        this_00 = *(FieldDescriptor **)
                   (*(long *)(*(long *)(pDVar4 + 0x40) + (long)field * 0x30 + 0x20) + lVar5 * 8);
        CVar1 = FieldDescriptor::cpp_type(this_00);
        if (CVar1 == CPPTYPE_MESSAGE) {
LAB_0027a70c:
          io::Printer::Print(printer,"const ");
        }
        else {
          CVar1 = FieldDescriptor::cpp_type(this_00);
          if (CVar1 == CPPTYPE_STRING) {
            CVar2 = EffectiveStringCType(this_00);
            if (CVar2 != FieldOptions_CType_STRING) goto LAB_0027a70c;
          }
        }
        pFVar3 = FieldGeneratorMap::get(&this->field_generators_,this_00);
        (*pFVar3->_vptr_FieldGenerator[2])(pFVar3,printer);
        pDVar4 = this->descriptor_;
      }
    }
    lVar5 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(pDVar4 + 0x2c); lVar6 = lVar6 + 1) {
      if (*(char *)(*(long *)(*(long *)(pDVar4 + 0x30) + 0x80 + lVar5) + 0x6f) == '\x01') {
        FieldName_abi_cxx11_(&local_50,(cpp *)(*(long *)(pDVar4 + 0x30) + lVar5),field);
        io::Printer::Print(printer,"  const ::google::protobuf::Message* $name$_;\n","name",
                           &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pDVar4 = this->descriptor_;
        field = extraout_RDX;
      }
      lVar5 = lVar5 + 0xa8;
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateExtraDefaultFields(io::Printer* printer) {
  // Generate oneof default instance and weak field instances for reflection
  // usage.
  if (descriptor_->oneof_decl_count() > 0 || num_weak_fields_ > 0) {
    printer->Print("public:\n");
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
            (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
             EffectiveStringCType(field) != FieldOptions::STRING)) {
          printer->Print("const ");
        }
        field_generators_.get(field).GeneratePrivateMembers(printer);
      }
    }
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->options().weak()) {
        printer->Print(
            "  const ::google::protobuf::Message* $name$_;\n", "name", FieldName(field));
      }
    }
  }
}